

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

void __thiscall
SmallDenseMap<unsigned_int,_ExternFuncInfo_*,_SmallDenseMapUnsignedHasher,_32U>::insert
          (SmallDenseMap<unsigned_int,_ExternFuncInfo_*,_SmallDenseMapUnsignedHasher,_32U> *this,
          uint *key,ExternFuncInfo **value)

{
  Node *pNVar1;
  uint uVar2;
  uint uVar3;
  Node *pNVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  if (*key == 0) {
    __assert_fail("key != Key()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                  ,0x3b,
                  "void SmallDenseMap<unsigned int, ExternFuncInfo *, SmallDenseMapUnsignedHasher, 32>::insert(const Key &, const Value &) [Key = unsigned int, Value = ExternFuncInfo *, Hasher = SmallDenseMapUnsignedHasher, N = 32]"
                 );
  }
  if (this->bucketCount <= (this->count >> 2) + this->count) {
    rehash(this);
  }
  uVar2 = this->bucketCount;
  if (uVar2 != 0) {
    uVar5 = *key * -0x61c88647 & uVar2 - 1;
    pNVar4 = this->data;
    uVar6 = 1;
    do {
      pNVar1 = pNVar4 + uVar5;
      uVar3 = pNVar4[uVar5].key;
      if (uVar3 == 0) {
        pNVar1->key = *key;
        pNVar1->value = *value;
        this->count = this->count + 1;
LAB_002a45ae:
        bVar7 = false;
      }
      else {
        if (uVar3 == *key) {
          pNVar1->value = *value;
          goto LAB_002a45ae;
        }
        uVar5 = uVar5 + uVar6 & uVar2 - 1;
        bVar7 = true;
      }
      if (!bVar7) {
        return;
      }
      bVar7 = uVar6 != uVar2;
      uVar6 = uVar6 + 1;
    } while (bVar7);
  }
  __assert_fail("!\"couldn\'t insert node\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                ,0x5b,
                "void SmallDenseMap<unsigned int, ExternFuncInfo *, SmallDenseMapUnsignedHasher, 32>::insert(const Key &, const Value &) [Key = unsigned int, Value = ExternFuncInfo *, Hasher = SmallDenseMapUnsignedHasher, N = 32]"
               );
}

Assistant:

void insert(const Key& key, const Value& value)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
			{
				item.key = key;
				item.value = value;

				count++;
				return;
			}

			if(item.key == key)
			{
				item.value = value;
				return;
			}

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}